

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O0

bool dlib::file_exists(string *filename)

{
  file_not_found *anon_var_0;
  file temp;
  string *in_stack_ffffffffffffff98;
  file *in_stack_ffffffffffffffa0;
  
  file::file(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  file::~file((file *)0x3d28f9);
  return true;
}

Assistant:

bool file_exists (
        const std::string& filename
    )
    {
        try
        {
            dlib::file temp(filename);
            return true;
        }
        catch (file::file_not_found&)
        {
            return false;
        }
    }